

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

err_t ClusterTimeChanged(matroska_cluster *Cluster)

{
  matroska_block *pmVar1;
  mkv_timestamp_t Timestamp;
  ebml_context *peVar2;
  bool_t bVar3;
  long Timestamp_00;
  matroska_block *Block;
  matroska_block *pmVar4;
  bool bVar5;
  
  (Cluster->Base).Base.bNeedDataSizeUpdate = '\x01';
  Timestamp = MATROSKA_ClusterTimestamp(Cluster);
  MATROSKA_ClusterSetTimestamp(Cluster,Timestamp);
  Block = (matroska_block *)(Cluster->Base).Base.Base.Children;
  do {
    if (Block == (matroska_block *)0x0) {
      return 0;
    }
    peVar2 = MATROSKA_getContextBlockGroup();
    bVar3 = EBML_ElementIsType((ebml_element *)Block,peVar2);
    if (bVar3 == 0) {
      peVar2 = MATROSKA_getContextSimpleBlock();
      bVar3 = EBML_ElementIsType((ebml_element *)Block,peVar2);
      if (bVar3 != 0) {
        Timestamp_00 = MATROSKA_BlockTimestamp(Block);
        pmVar4 = Block;
joined_r0x0010b2b8:
        if (Timestamp_00 != 0x7fffffffffffffff) {
          MATROSKA_BlockSetTimestamp(pmVar4,Timestamp_00,Timestamp);
        }
      }
    }
    else {
      pmVar4 = (matroska_block *)(Block->Base).Base.Base.Children;
      while (pmVar4 != (matroska_block *)0x0) {
        peVar2 = MATROSKA_getContextBlock();
        bVar3 = EBML_ElementIsType((ebml_element *)pmVar4,peVar2);
        if (bVar3 != 0) {
          Timestamp_00 = MATROSKA_BlockTimestamp(pmVar4);
          goto joined_r0x0010b2b8;
        }
        pmVar1 = (matroska_block *)(pmVar4->Base).Base.Base.Next;
        bVar5 = pmVar4 == pmVar1;
        pmVar4 = pmVar1;
        if (bVar5) {
          __assert_fail("(nodetree*)(GBlock) != ((nodetree*)(GBlock))->Next",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x7a,"err_t ClusterTimeChanged(matroska_cluster *)");
        }
      }
    }
    pmVar4 = (matroska_block *)(Block->Base).Base.Base.Next;
    bVar5 = Block == pmVar4;
    Block = pmVar4;
    if (bVar5) {
      __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x76,"err_t ClusterTimeChanged(matroska_cluster *)");
    }
  } while( true );
}

Assistant:

static err_t ClusterTimeChanged(matroska_cluster *Cluster)
{
    mkv_timestamp_t ClusterTimestamp;
#if defined(CONFIG_EBML_WRITING)
    mkv_timestamp_t BlockTimestamp;
    ebml_element *Elt, *GBlock;
#endif

    Cluster->Base.Base.bNeedDataSizeUpdate = 1;
    ClusterTimestamp = MATROSKA_ClusterTimestamp(Cluster);
    MATROSKA_ClusterSetTimestamp(Cluster, ClusterTimestamp);
#if defined(CONFIG_EBML_WRITING)
    for (Elt = EBML_MasterChildren(Cluster); Elt; Elt = EBML_MasterNext(Elt))
    {
        if (EBML_ElementIsType(Elt, MATROSKA_getContextBlockGroup()))
        {
            for (GBlock = EBML_MasterChildren(Elt);GBlock;GBlock=EBML_MasterNext(GBlock))
            {
                if (EBML_ElementIsType(GBlock, MATROSKA_getContextBlock()))
                {
                    BlockTimestamp = MATROSKA_BlockTimestamp((matroska_block*)GBlock);
                    if (BlockTimestamp!=INVALID_TIMESTAMP_T)
                        MATROSKA_BlockSetTimestamp((matroska_block*)GBlock, BlockTimestamp, ClusterTimestamp);
                    break;
                }
            }
        }
        else if (EBML_ElementIsType(Elt, MATROSKA_getContextSimpleBlock()))
        {
            BlockTimestamp = MATROSKA_BlockTimestamp((matroska_block*)Elt);
            if (BlockTimestamp!=INVALID_TIMESTAMP_T)
                MATROSKA_BlockSetTimestamp((matroska_block*)Elt, BlockTimestamp, ClusterTimestamp);
        }
    }
#endif
    return ERR_NONE;
}